

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

void __thiscall minja::ExpressionNode::~ExpressionNode(ExpressionNode *this)

{
  (this->super_TemplateNode)._vptr_TemplateNode = (_func_int **)&PTR_do_render_002336f8;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->expr).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  TemplateNode::~TemplateNode(&this->super_TemplateNode);
  return;
}

Assistant:

ExpressionNode(const Location & loc, std::shared_ptr<Expression> && e) : TemplateNode(loc), expr(std::move(e)) {}